

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

bool __thiscall crnlib::dxt_image::flip_y(dxt_image *this)

{
  uint8 uVar1;
  uint8 uVar2;
  element_type eVar3;
  uint value;
  uint value_00;
  int iVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  int iVar8;
  uint bit_ofs;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  dxt_image *pdVar13;
  uint uVar14;
  byte bVar15;
  ulong uVar16;
  uint x;
  uint x_00;
  uint uVar17;
  element tmp;
  dxt3_block local_70;
  uint local_68;
  uint local_64;
  dxt_image *local_60;
  ulong local_58;
  int local_50;
  int local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (((uint)(this->m_format + ~cDXN_YX) < 5) ||
     (uVar14 = this->m_height, 4 < uVar14 && (uVar14 & 3) != 0)) {
    bVar10 = false;
  }
  else {
    bVar10 = true;
    if (uVar14 != 1) {
      local_60 = this;
      local_64 = this->m_blocks_y >> 1;
      if (1 < this->m_blocks_y) {
        uVar11 = 0;
        do {
          flip_row(local_60,uVar11);
          uVar11 = uVar11 + 1;
        } while (local_64 != uVar11);
      }
      if ((local_60->m_blocks_y & 1) != 0) {
        local_68 = local_60->m_height;
        uVar16 = 4;
        if (local_68 < 4) {
          uVar16 = (ulong)local_68;
        }
        if (local_60->m_blocks_x != 0) {
          local_58 = uVar16 >> 1;
          local_50 = (int)uVar16 * 0xc + -0xc;
          local_40 = 0;
          local_48 = uVar16;
          pdVar13 = local_60;
          uVar11 = local_64;
          do {
            uVar5 = (ulong)pdVar13->m_num_elements_per_block;
            if (pdVar13->m_num_elements_per_block != 0) {
              local_38 = 0;
              do {
                local_70.m_alpha =
                     *&pdVar13->m_pElements
                       [(int)local_38 + (pdVar13->m_blocks_x * uVar11 + (int)local_40) * (int)uVar5]
                       .m_bytes;
                eVar3 = pdVar13->m_element_type[local_38];
                if (eVar3 == cAlphaDXT5) {
                  if (1 < local_68) {
                    iVar12 = 0;
                    iVar4 = 0;
                    iVar8 = local_50;
                    do {
                      local_4c = iVar4;
                      iVar4 = 0;
                      do {
                        uVar5 = (ulong)((uint)(iVar12 + iVar4) >> 3);
                        uVar1 = local_70.m_alpha[uVar5 + 2];
                        uVar2 = local_70.m_alpha[uVar5 + 3];
                        bVar6 = (byte)(iVar12 + iVar4) & 7;
                        uVar14 = iVar8 + iVar4;
                        uVar16 = (ulong)(uVar14 >> 3);
                        uVar17 = (uint)local_70.m_alpha[uVar16 + 2];
                        if (uVar14 < 0x28) {
                          uVar17 = (uint)CONCAT11(local_70.m_alpha[uVar16 + 3],
                                                  local_70.m_alpha[uVar16 + 2]);
                        }
                        bVar7 = (byte)uVar14 & 7;
                        *(ushort *)(local_70.m_alpha + uVar5 + 2) =
                             (ushort)((uVar17 >> bVar7 & 7) << bVar6) |
                             ~(ushort)(7 << bVar6) & CONCAT11(local_70.m_alpha[uVar5 + 3],uVar1);
                        uVar17 = (uint)local_70.m_alpha[uVar16 + 2];
                        if (uVar14 < 0x28) {
                          uVar17 = (uint)CONCAT11(local_70.m_alpha[uVar16 + 3],
                                                  local_70.m_alpha[uVar16 + 2]);
                        }
                        uVar17 = ((ushort)(CONCAT11(uVar2,uVar1) >> bVar6) & 7) << bVar7 |
                                 ~(7 << bVar7) & uVar17;
                        local_70.m_alpha[uVar16 + 2] = (uint8)uVar17;
                        if (uVar14 < 0x28) {
                          local_70.m_alpha[uVar16 + 3] = (uint8)(uVar17 >> 8);
                        }
                        iVar4 = iVar4 + 3;
                      } while (iVar4 != 0xc);
                      iVar4 = local_4c + 1;
                      iVar8 = iVar8 + -0xc;
                      iVar12 = iVar12 + 0xc;
                      uVar16 = local_48;
                    } while (iVar4 != (uint)local_58);
                  }
                }
                else if (eVar3 == cAlphaDXT3) {
                  if (1 < local_68) {
                    uVar14 = 0;
                    do {
                      uVar11 = ~uVar14 + (int)uVar16;
                      x_00 = 0;
                      do {
                        value = dxt3_block::get_alpha(&local_70,x_00,uVar14,false);
                        value_00 = dxt3_block::get_alpha(&local_70,x_00,uVar11,false);
                        dxt3_block::set_alpha(&local_70,x_00,uVar14,value_00,false);
                        dxt3_block::set_alpha(&local_70,x_00,uVar11,value,false);
                        x_00 = x_00 + 1;
                      } while (x_00 != 4);
                      uVar14 = uVar14 + 1;
                      uVar16 = local_48;
                    } while (uVar14 != (uint)local_58);
                  }
                }
                else if ((eVar3 == cColorDXT1) && (1 < local_68)) {
                  uVar5 = 0;
                  do {
                    uVar9 = (ulong)(~(uint)uVar5 + (int)uVar16);
                    iVar8 = 0;
                    do {
                      bVar6 = local_70.m_alpha[uVar5 + 4];
                      bVar7 = (byte)iVar8;
                      bVar15 = ~(byte)(3 << (bVar7 & 0x1f));
                      local_70.m_alpha[uVar5 + 4] =
                           (byte)((local_70.m_alpha[uVar9 + 4] >> (bVar7 & 0x1f) & 3) <<
                                 (bVar7 & 0x1f)) | bVar6 & bVar15;
                      local_70.m_alpha[uVar9 + 4] =
                           (byte)((bVar6 >> (bVar7 & 0x1f) & 3) << (bVar7 & 0x1f)) |
                           bVar15 & local_70.m_alpha[uVar9 + 4];
                      iVar8 = iVar8 + 2;
                    } while (iVar8 != 8);
                    uVar5 = uVar5 + 1;
                  } while (uVar5 != local_58);
                }
                *&local_60->m_pElements
                  [(local_60->m_blocks_x * local_64 + (int)local_40) *
                   local_60->m_num_elements_per_block + (int)local_38].m_bytes = local_70.m_alpha;
                local_38 = local_38 + 1;
                uVar5 = (ulong)local_60->m_num_elements_per_block;
                pdVar13 = local_60;
                uVar11 = local_64;
              } while (local_38 < uVar5);
            }
            uVar14 = (int)local_40 + 1;
            local_40 = (ulong)uVar14;
          } while (uVar14 < pdVar13->m_blocks_x);
          bVar10 = true;
        }
      }
    }
  }
  return bVar10;
}

Assistant:

bool dxt_image::flip_y()
    {
        if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS)
        {
            // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
            return false;
        }

        if ((m_height & 3) && (m_height > 4))
        {
            return false;
        }

        if (m_height == 1)
        {
            return true;
        }

        const uint mid_y = m_blocks_y / 2;

        for (uint y = 0; y < mid_y; y++)
        {
            flip_row(y);
        }

        if (m_blocks_y & 1)
        {
            const uint h = math::minimum(m_height, 4U);
            for (uint x = 0; x < m_blocks_x; x++)
            {
                for (uint e = 0; e < get_elements_per_block(); e++)
                {
                    element tmp(get_element(x, mid_y, e));
                    switch (get_element_type(e))
                    {
                    case cColorDXT1:
                        reinterpret_cast<dxt1_block*>(&tmp)->flip_y(4, h);
                        break;
                    case cAlphaDXT3:
                        reinterpret_cast<dxt3_block*>(&tmp)->flip_y(4, h);
                        break;
                    case cAlphaDXT5:
                        reinterpret_cast<dxt5_block*>(&tmp)->flip_y(4, h);
                        break;
                    default:
                        CRNLIB_ASSERT(0);
                        break;
                    }
                    get_element(x, mid_y, e) = tmp;
                }
            }
        }

        return true;
    }